

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

NetSymbol * __thiscall
slang::BumpAllocator::
emplace<slang::ast::NetSymbol,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::NetType_const&>
          (BumpAllocator *this,basic_string_view<char,_std::char_traits<char>_> *args,
          SourceLocation *args_1,NetType *args_2)

{
  string_view name;
  NetSymbol *this_00;
  
  this_00 = (NetSymbol *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((NetSymbol *)this->endPtr < this_00 + 1) {
    this_00 = (NetSymbol *)allocateSlow(this,0x170,8);
  }
  else {
    this->head->current = (byte *)(this_00 + 1);
  }
  name._M_len = args->_M_len;
  name._M_str = args->_M_str;
  ast::NetSymbol::NetSymbol(this_00,name,*args_1,args_2);
  return this_00;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }